

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

uint64_t getHouseList(int *out,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  uint64_t rng;
  
  rng = chunkGenerateRnd(seed,chunkX,chunkZ);
  skipNextN(&rng,1);
  iVar1 = nextInt(&rng,3);
  *out = iVar1 + 2;
  iVar1 = nextInt(&rng,2);
  out[1] = iVar1;
  iVar1 = nextInt(&rng,3);
  out[2] = iVar1;
  iVar1 = nextInt(&rng,4);
  out[3] = iVar1 + 2;
  iVar1 = nextInt(&rng,3);
  out[4] = iVar1;
  iVar1 = nextInt(&rng,4);
  out[5] = iVar1 + 1;
  iVar1 = nextInt(&rng,3);
  out[6] = iVar1 + 2;
  iVar1 = nextInt(&rng,2);
  out[7] = iVar1;
  iVar1 = nextInt(&rng,4);
  out[8] = iVar1;
  return rng;
}

Assistant:

uint64_t getHouseList(int *out, uint64_t seed, int chunkX, int chunkZ)
{
    uint64_t rng = chunkGenerateRnd(seed, chunkX, chunkZ);
    skipNextN(&rng, 1);

    out[HouseSmall] = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Church]     = nextInt(&rng, 1 - 0 + 1) + 0;
    out[Library]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[WoodHut]    = nextInt(&rng, 5 - 2 + 1) + 2;
    out[Butcher]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[FarmLarge]  = nextInt(&rng, 4 - 1 + 1) + 1;
    out[FarmSmall]  = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Blacksmith] = nextInt(&rng, 1 - 0 + 1) + 0;
    out[HouseLarge] = nextInt(&rng, 3 - 0 + 1) + 0;

    return rng;
}